

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFMatrix<long_double>::TPZFMatrix
          (TPZFMatrix<long_double> *this,initializer_list<long_double> *list)

{
  ulong uVar1;
  iterator plVar2;
  longdouble *plVar3;
  long lVar4;
  
  TPZMatrix<long_double>::TPZMatrix
            (&this->super_TPZMatrix<long_double>,&PTR_PTR_01654978,list->_M_len,1);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_016546c0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016491a8;
  (this->fWork).fNAlloc = 0;
  (this->fWork).fStore = (longdouble *)0x0;
  (this->fWork).fNElements = 0;
  uVar1 = list->_M_len;
  if (uVar1 == 0) {
    plVar3 = this->fElem;
  }
  else {
    plVar3 = (longdouble *)operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 << 4);
    this->fElem = plVar3;
  }
  plVar2 = list->_M_array;
  for (lVar4 = 0; uVar1 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
    *(unkbyte10 *)((long)plVar3 + lVar4) = *(unkbyte10 *)((long)plVar2 + lVar4);
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<TVar>& list) 
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>(list.size(), 1)
{
	if (list.size() > 0) {
		this->fElem = new TVar[list.size()];
	}

	auto it = list.begin();
	auto it_end = list.end();
	TVar* aux = fElem;
	for (; it != it_end; it++, aux++)
		*aux = *it;
}